

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void pbrt::ConnectToDisplayServer(string *host)

{
  IPCChannel *this;
  thread tStack_18;
  
  if (channel == (IPCChannel *)0x0) {
    this = (IPCChannel *)operator_new(0x50);
    IPCChannel::IPCChannel(this,host);
    channel = this;
    std::thread::thread<void(&)(),,void>(&tStack_18,updateDynamicItems);
    std::thread::operator=((thread *)&updateThread,&tStack_18);
    std::thread::~thread(&tStack_18);
    return;
  }
  LogFatal<char_const(&)[19]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
             ,0x1a3,"Check failed: %s",(char (*) [19])"channel == nullptr");
}

Assistant:

void ConnectToDisplayServer(const std::string &host) {
    CHECK(channel == nullptr);
    channel = new IPCChannel(host);

    updateThread = std::thread(updateDynamicItems);
}